

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_split.c
# Opt level: O2

REF_STATUS
ref_split_edge_density
          (REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT new_node,REF_BOOL *allowed)

{
  REF_CELL ref_cell;
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  undefined8 uVar6;
  int iVar7;
  REF_INT cell;
  char *pcVar8;
  REF_DBL area;
  REF_INT local_e4;
  REF_NODE local_e0;
  double local_d8;
  undefined8 uStack_d0;
  uint *local_c8;
  ulong local_c0;
  double local_b8;
  undefined8 uStack_b0;
  REF_INT nodes [27];
  
  local_e0 = ref_grid->node;
  *allowed = 1;
  if (ref_grid->twod != 0) {
    ref_cell = ref_grid->cell[3];
    local_c0 = 0xffffffff;
    local_e4 = -1;
    if (-1 < node0) {
      pRVar1 = ref_cell->ref_adj;
      local_c0 = 0xffffffff;
      local_e4 = -1;
      if (node0 < pRVar1->nnode) {
        uVar3 = pRVar1->first[(uint)node0];
        local_c0 = 0xffffffff;
        local_e4 = -1;
        if ((long)(int)uVar3 != -1) {
          local_e4 = pRVar1->item[(int)uVar3].ref;
          local_c0 = (ulong)uVar3;
        }
      }
    }
    local_d8 = 0.0;
    uStack_d0 = 0;
    local_b8 = 0.0;
    uStack_b0 = 0;
    local_c8 = (uint *)allowed;
    while ((int)local_c0 != -1) {
      cell = local_e4;
      for (iVar7 = 0; iVar7 < ref_cell->node_per; iVar7 = iVar7 + 1) {
        if (ref_cell->c2n[ref_cell->size_per * cell + iVar7] == node1) {
          uVar3 = ref_cell_nodes(ref_cell,cell,nodes);
          if (uVar3 != 0) {
            pcVar8 = "cell nodes";
            uVar6 = 0x2d0;
LAB_001dfb13:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                   ,uVar6,"ref_split_edge_density",(ulong)uVar3,pcVar8);
            return uVar3;
          }
          for (lVar4 = 0; lVar4 < ref_cell->node_per; lVar4 = lVar4 + 1) {
            if (nodes[lVar4] == node0) {
              nodes[lVar4] = new_node;
            }
          }
          uVar3 = ref_node_tri_metric_area(local_e0,nodes,&area);
          if (uVar3 != 0) {
            pcVar8 = "tri area";
            uVar6 = 0x2d4;
            goto LAB_001dfb13;
          }
          local_d8 = local_d8 + area;
          for (lVar4 = 0; uVar5 = (ulong)ref_cell->node_per, lVar4 < (long)uVar5; lVar4 = lVar4 + 1)
          {
            if (nodes[lVar4] == new_node) {
              nodes[lVar4] = node0;
            }
          }
          for (lVar4 = 0; lVar4 < (int)uVar5; lVar4 = lVar4 + 1) {
            if (nodes[lVar4] == node1) {
              nodes[lVar4] = new_node;
              uVar5 = (ulong)(uint)ref_cell->node_per;
            }
          }
          uVar3 = ref_node_tri_metric_area(local_e0,nodes,&area);
          if (uVar3 != 0) {
            pcVar8 = "tri area";
            uVar6 = 0x2de;
            goto LAB_001dfb13;
          }
          local_d8 = local_d8 + area;
          local_b8 = local_b8 + 1.0 + 1.0;
          cell = local_e4;
        }
      }
      pRVar2 = ref_cell->ref_adj->item;
      local_c0 = (ulong)pRVar2[(int)local_c0].next;
      local_e4 = -1;
      if (local_c0 != 0xffffffffffffffff) {
        local_e4 = pRVar2[local_c0].ref;
      }
    }
    *local_c8 = (uint)(0.5 < (double)(~-(ulong)(0.5 < local_b8) & (ulong)local_d8 |
                                     (ulong)(local_d8 / local_b8) & -(ulong)(0.5 < local_b8)));
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_split_edge_density(REF_GRID ref_grid, REF_INT node0,
                                          REF_INT node1, REF_INT new_node,
                                          REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, cell_node;
  REF_INT node;
  REF_DBL area, density, hits;

  *allowed = REF_TRUE;

  if (!ref_grid_twod(ref_grid)) {
    return REF_SUCCESS;
  }

  ref_cell = ref_grid_tri(ref_grid);

  density = 0.0;
  hits = 0.0;
  each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node0 == nodes[node]) nodes[node] = new_node;
    }
    RSS(ref_node_tri_metric_area(ref_node, nodes, &area), "tri area");
    density += area;
    hits += 1.0;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (new_node == nodes[node]) nodes[node] = node0;
    }
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node1 == nodes[node]) nodes[node] = new_node;
    }
    RSS(ref_node_tri_metric_area(ref_node, nodes, &area), "tri area");
    density += area;
    hits += 1.0;
  }

  if (hits > 0.5) density /= hits;

  if (density > 0.5) {
    *allowed = REF_TRUE;
  } else {
    *allowed = REF_FALSE;
  }

  return REF_SUCCESS;
}